

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebFront.hpp
# Opt level: O0

void __thiscall
webfront::
BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::onEvent(BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
          *this,WebLinkEvent *event)

{
  int iVar1;
  BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  __args;
  span<const_std::byte,_18446744073709551615UL> __args_00;
  BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
  *in_RSI;
  __extent_storage<18446744073709551615UL> in_RDI;
  key_type *in_stack_ffffffffffffffa8;
  function<void_(std::span<const_std::byte,_18446744073709551615UL>)> *in_stack_ffffffffffffffb0;
  function<void_(webfront::BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>)>
  *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
  *in_stack_ffffffffffffffd0;
  BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  local_20 [2];
  
  iVar1 = *(int *)&(in_RSI->httpServer).ioContext.super_execution_context.service_registry_;
  if (iVar1 == 0) {
    this_00 = &((BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
                 *)in_RDI._M_extent_value)->uiStartedHandler;
    BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
    ::BasicUI(local_20,(BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
                        *)in_RDI._M_extent_value,
              *(WebLinkId *)
               ((long)&(in_RSI->httpServer).ioContext.super_execution_context.service_registry_ + 4)
             );
    __args._8_8_ = in_RDI._M_extent_value;
    __args.webFront = in_RSI;
    http::std::
    function<void_(webfront::BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>)>
    ::operator()(this_00,__args);
  }
  else if (iVar1 == 1) {
    http::std::
    map<unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
    ::erase((map<unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
             *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (iVar1 == 2) {
    http::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
    ::at(in_stack_ffffffffffffffd0,(key_type *)CONCAT44(2,in_stack_ffffffffffffffc8));
    __args_00._M_extent._M_extent_value = in_RDI._M_extent_value;
    __args_00._M_ptr = (pointer)in_RSI;
    http::std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>::operator()
              (in_stack_ffffffffffffffb0,__args_00);
  }
  return;
}

Assistant:

void onEvent(WebLinkEvent event) {
        switch (event.code) {
        case WebLinkEvent::Code::linked: uiStartedHandler(UI{*this, event.webLinkId}); break;
        case WebLinkEvent::Code::closed: webLinks.erase(event.webLinkId); break;
        case WebLinkEvent::Code::cppFunctionCalled: cppFunctions.at(event.text)(event.data); break;
        }
    }